

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialFDS.cpp
# Opt level: O2

void __thiscall PolynomialFDS::display(PolynomialFDS *this,ostream *o)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  string local_50;
  
  poVar1 = std::operator<<(o,"PolynomialFDS numstates=");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->mNumStates);
  poVar1 = std::operator<<(poVar1," numvars=");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar1,
                      (int)((ulong)((long)(this->mPolynomials).
                                          super__Vector_base<Polynomial,_std::allocator<Polynomial>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->mPolynomials).
                                         super__Vector_base<Polynomial,_std::allocator<Polynomial>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 6));
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar3 = 0;
  lVar2 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(this->mPolynomials).
                            super__Vector_base<Polynomial,_std::allocator<Polynomial>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->mPolynomials).
                            super__Vector_base<Polynomial,_std::allocator<Polynomial>_>._M_impl.
                            super__Vector_impl_data._M_start >> 6); uVar4 = uVar4 + 1) {
    poVar1 = std::operator<<(o,"  ");
    poVar1 = std::operator<<(poVar1,(string *)
                                    ((long)&(((this->mVariableNames).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar2));
    poVar1 = std::operator<<(poVar1," = ");
    Polynomial::evaluateSymbolic
              (&local_50,
               (Polynomial *)
               ((long)&((this->mPolynomials).
                        super__Vector_base<Polynomial,_std::allocator<Polynomial>_>._M_impl.
                        super__Vector_impl_data._M_start)->mNumStates + lVar3),&this->mVariableNames
              );
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = lVar2 + 0x20;
    lVar3 = lVar3 + 0x40;
  }
  return;
}

Assistant:

void PolynomialFDS::display(std::ostream& o)
{
  o << "PolynomialFDS numstates=" << numStates()
    << " numvars=" << numVariables()
    << std::endl;
  for (int i=0; i < mPolynomials.size(); i++)
    o << "  " << mVariableNames[i] << " = " << mPolynomials[i].evaluateSymbolic(mVariableNames) << std::endl;
}